

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_conn_cf_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  bool bVar1;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  data_local = (Curl_easy *)cf;
  while( true ) {
    bVar1 = false;
    if (((data_local != (Curl_easy *)0x0) &&
        (bVar1 = false, ((ulong)(data_local->multi_queue)._list & 0x100000000) == 0)) &&
       (bVar1 = false, data_local->id != 0)) {
      bVar1 = (*(byte *)(data_local->id + 0x24) & 1) == 0;
    }
    if (!bVar1) break;
    data_local = (Curl_easy *)data_local->id;
  }
  while( true ) {
    bVar1 = false;
    if (data_local != (Curl_easy *)0x0) {
      bVar1 = (*(byte *)((long)&(data_local->multi_queue)._list + 4) >> 1 & 1) != 0;
    }
    if (!bVar1) break;
    data_local = (Curl_easy *)data_local->id;
  }
  for (; data_local != (Curl_easy *)0x0; data_local = (Curl_easy *)data_local->id) {
    (**(code **)(*(long *)data_local + 0x38))(data_local,data,ps);
  }
  return;
}

Assistant:

void Curl_conn_cf_adjust_pollset(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct easy_pollset *ps)
{
  /* Get the lowest not-connected filter, if there are any */
  while(cf && !cf->connected && cf->next && !cf->next->connected)
    cf = cf->next;
  /* Skip all filters that have already shut down */
  while(cf && cf->shutdown)
    cf = cf->next;
  /* From there on, give all filters a chance to adjust the pollset.
   * Lower filters are called later, so they may override */
  while(cf) {
    cf->cft->adjust_pollset(cf, data, ps);
    cf = cf->next;
  }
}